

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexbuffers.h
# Opt level: O3

Value __thiscall
flexbuffers::Builder::CreateVector
          (Builder *this,size_t start,size_t vec_len,size_t step,bool typed,bool fixed,Value *keys)

{
  iterator __position;
  BitWidth BVar1;
  pointer pVVar2;
  BitWidth BVar3;
  int iVar4;
  BitWidth BVar5;
  pointer pVVar6;
  undefined3 in_register_00000081;
  undefined3 in_register_00000089;
  long lVar7;
  size_t sVar8;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  Value VVar12;
  byte local_75;
  undefined4 local_74;
  ulong local_70;
  value_type_conflict1 local_61;
  undefined8 local_60;
  undefined4 local_54;
  pointer local_50;
  pointer local_48;
  size_t local_40;
  size_t local_38;
  
  local_54 = CONCAT31(in_register_00000089,fixed);
  local_74 = CONCAT31(in_register_00000081,typed);
  if (fixed && !typed) {
    __assert_fail("!fixed || typed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/include/flatbuffers/flexbuffers.h"
                  ,0x64a,
                  "Value flexbuffers::Builder::CreateVector(size_t, size_t, size_t, bool, bool, const Value *)"
                 );
  }
  BVar5 = BIT_WIDTH_8;
  if ((0xff < vec_len) && (BVar5 = BIT_WIDTH_16, 0xffff < vec_len)) {
    BVar5 = BIT_WIDTH_64 - (vec_len >> 0x20 == 0);
  }
  if ((int)BVar5 < (int)this->force_min_bit_width_) {
    BVar5 = this->force_min_bit_width_;
  }
  local_40 = vec_len;
  if (keys == (Value *)0x0) {
    local_60 = 1;
  }
  else {
    BVar1 = Value::ElemWidth(keys,(long)(this->buf_).
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(this->buf_).
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_start,0);
    if ((int)BVar1 < (int)BVar5) {
      BVar1 = BVar5;
    }
    local_60 = 3;
    BVar5 = BVar1;
  }
  pVVar2 = (this->stack_).
           super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_70 = 4;
  local_38 = start;
  if (start < (ulong)((long)(this->stack_).
                            super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar2 >> 4)) {
    lVar7 = start << 4;
    local_48 = (pointer)(step << 4);
    local_70 = 4;
    lVar10 = 0;
    local_50 = (pointer)lVar7;
    do {
      BVar1 = Value::ElemWidth((Value *)((long)&pVVar2->field_0 + lVar7),
                               (long)(this->buf_).
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(this->buf_).
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start,local_60 + lVar10);
      if ((int)BVar1 < (int)BVar5) {
        BVar1 = BVar5;
      }
      BVar5 = BVar1;
      if ((char)local_74 == '\0') {
        pVVar2 = (this->stack_).
                 super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      }
      else {
        pVVar2 = (this->stack_).
                 super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (lVar10 == 0) {
          local_70 = (ulong)*(uint *)((long)&pVVar2->type_ + (long)local_50);
        }
        else if ((int)local_70 != *(int *)((long)&pVVar2->type_ + lVar7)) {
          __assert_fail("vector_type == stack_[i].type_",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/include/flatbuffers/flexbuffers.h"
                        ,0x660,
                        "Value flexbuffers::Builder::CreateVector(size_t, size_t, size_t, bool, bool, const Value *)"
                       );
        }
      }
      lVar10 = lVar10 + step;
      lVar7 = lVar7 + (long)local_48;
    } while (local_38 + lVar10 <
             (ulong)((long)(this->stack_).
                           super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar2 >> 4));
  }
  sVar8 = local_38;
  if ((((char)local_74 != '\0') && (4 < (int)local_70 - 1U)) && ((int)local_70 != 0x1a)) {
    __assert_fail("!typed || IsTypedVectorElementType(vector_type)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/include/flatbuffers/flexbuffers.h"
                  ,0x666,
                  "Value flexbuffers::Builder::CreateVector(size_t, size_t, size_t, bool, bool, const Value *)"
                 );
  }
  uVar9 = 1 << ((byte)BVar5 & 0x1f);
  __position._M_current =
       (this->buf_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_61 = '\0';
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_fill_insert
            (&this->buf_,__position,
             (ulong)uVar9 - 1 &
             (long)(this->buf_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start - (long)__position._M_current,&local_61)
  ;
  local_60 = CONCAT44(local_60._4_4_,uVar9) & 0xffffffff000000ff;
  if (keys != (Value *)0x0) {
    WriteOffset(this,(keys->field_0).u_,(uint8_t)local_60);
    Write<unsigned_long>(this,1L << ((char)keys->min_bit_width_ & 0x3f),(ulong)(uVar9 & 0xff));
  }
  if ((char)local_54 == '\0') {
    Write<unsigned_long>(this,local_40,(ulong)uVar9 & 0xff);
  }
  local_50 = (this->buf_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_48 = (this->buf_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish;
  pVVar2 = (this->stack_).
           super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pVVar6 = (this->stack_).
           super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (sVar8 < (ulong)((long)pVVar2 - (long)pVVar6 >> 4)) {
    lVar7 = sVar8 << 4;
    do {
      WriteAny(this,(Value *)((long)&pVVar6->field_0 + lVar7),(uint8_t)local_60);
      sVar8 = sVar8 + step;
      pVVar6 = (this->stack_).
               super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pVVar2 = (this->stack_).
               super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      lVar7 = lVar7 + step * 0x10;
    } while (sVar8 < (ulong)((long)pVVar2 - (long)pVVar6 >> 4));
  }
  if ((char)local_74 == '\0') {
    if ((ulong)((long)pVVar2 - (long)pVVar6 >> 4) <= local_38) {
      iVar4 = (keys == (Value *)0x0) + 9;
      goto LAB_0013f895;
    }
    uVar11 = local_38 << 4 | 0xc;
    sVar8 = local_38;
    do {
      BVar1 = *(BitWidth *)((long)&pVVar6->field_0 + uVar11);
      BVar3 = BVar5;
      if ((int)BVar5 < (int)BVar1) {
        BVar3 = BVar1;
      }
      iVar4 = *(int *)((long)pVVar6 + (uVar11 - 4));
      if (iVar4 == 0x1a) {
        BVar1 = BVar3;
      }
      local_75 = (byte)BVar1;
      if (iVar4 < 4) {
        local_75 = (byte)BVar3;
      }
      local_75 = (byte)(iVar4 << 2) | local_75;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                (&this->buf_,&local_75);
      sVar8 = sVar8 + step;
      pVVar6 = (this->stack_).
               super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar11 = uVar11 + step * 0x10;
    } while (sVar8 < (ulong)((long)(this->stack_).
                                   super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar6 >> 4));
  }
  if (((byte)local_74 & keys == (Value *)0x0) == 1) {
    iVar4 = (int)local_70;
    if ((4 < iVar4 - 1U) && (iVar4 != 0x1a)) {
      __assert_fail("IsTypedVectorElementType(t)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/include/flatbuffers/flexbuffers.h"
                    ,0x69,"Type flexbuffers::ToTypedVector(Type, size_t)");
    }
    uVar11 = 0;
    if ((char)local_54 != '\0') {
      uVar11 = local_40;
    }
    if ((4 < uVar11) || ((0x1dU >> ((uint)uVar11 & 0x1f) & 1) == 0)) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/include/flatbuffers/flexbuffers.h"
                    ,0x6f,"Type flexbuffers::ToTypedVector(Type, size_t)");
    }
    iVar4 = iVar4 + (&DAT_003573ec)[uVar11];
  }
  else {
    iVar4 = (keys == (Value *)0x0) + 9;
  }
LAB_0013f895:
  VVar12.field_0.i_ = (long)local_48 - (long)local_50;
  VVar12.min_bit_width_ = BVar5;
  VVar12.type_ = iVar4;
  return VVar12;
}

Assistant:

Value CreateVector(size_t start, size_t vec_len, size_t step, bool typed,
                     bool fixed, const Value *keys = nullptr) {
    FLATBUFFERS_ASSERT(
        !fixed ||
        typed);  // typed=false, fixed=true combination is not supported.
    // Figure out smallest bit width we can store this vector with.
    auto bit_width = (std::max)(force_min_bit_width_, WidthU(vec_len));
    auto prefix_elems = 1;
    if (keys) {
      // If this vector is part of a map, we will pre-fix an offset to the keys
      // to this vector.
      bit_width = (std::max)(bit_width, keys->ElemWidth(buf_.size(), 0));
      prefix_elems += 2;
    }
    Type vector_type = FBT_KEY;
    // Check bit widths and types for all elements.
    for (size_t i = start; i < stack_.size(); i += step) {
      auto elem_width =
          stack_[i].ElemWidth(buf_.size(), i - start + prefix_elems);
      bit_width = (std::max)(bit_width, elem_width);
      if (typed) {
        if (i == start) {
          vector_type = stack_[i].type_;
        } else {
          // If you get this assert, you are writing a typed vector with
          // elements that are not all the same type.
          FLATBUFFERS_ASSERT(vector_type == stack_[i].type_);
        }
      }
    }
    // If you get this assert, your typed types are not one of:
    // Int / UInt / Float / Key.
    FLATBUFFERS_ASSERT(!typed || IsTypedVectorElementType(vector_type));
    auto byte_width = Align(bit_width);
    // Write vector. First the keys width/offset if available, and size.
    if (keys) {
      WriteOffset(keys->u_, byte_width);
      Write<uint64_t>(1ULL << keys->min_bit_width_, byte_width);
    }
    if (!fixed) Write<uint64_t>(vec_len, byte_width);
    // Then the actual data.
    auto vloc = buf_.size();
    for (size_t i = start; i < stack_.size(); i += step) {
      WriteAny(stack_[i], byte_width);
    }
    // Then the types.
    if (!typed) {
      for (size_t i = start; i < stack_.size(); i += step) {
        buf_.push_back(stack_[i].StoredPackedType(bit_width));
      }
    }
    return Value(static_cast<uint64_t>(vloc),
                 keys ? FBT_MAP
                      : (typed ? ToTypedVector(vector_type, fixed ? vec_len : 0)
                               : FBT_VECTOR),
                 bit_width);
  }